

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O0

void print_package_name(int index)

{
  LispPTR LVar1;
  LispPTR *pLVar2;
  DLword *local_30;
  char *pname;
  DLword len;
  NEWSTRINGP *namestring;
  PACKAGE *package;
  int index_local;
  
  if (index == 0) {
    printf("#:");
  }
  else {
    LVar1 = aref1(*Package_from_Index_word,index);
    pLVar2 = NativeAligned4FromLAddr(LVar1);
    pLVar2 = NativeAligned4FromLAddr(pLVar2[2]);
    local_30 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
    if ((short)pLVar2[1] != 0) {
      local_30 = (DLword *)((long)local_30 + (long)(int)(uint)(ushort)pLVar2[1]);
      printf("OFFSET:\n");
    }
    pname._6_2_ = (DLword)pLVar2[2];
    LVar1 = compare_chars((char *)local_30,"INTERLISP",pname._6_2_);
    if (LVar1 == 1) {
      printf("IL:");
    }
    else {
      LVar1 = compare_chars((char *)local_30,"LISP",pname._6_2_);
      if (LVar1 == 1) {
        printf("CL:");
      }
      else {
        LVar1 = compare_chars((char *)local_30,"XEROX-COMMON-LISP",pname._6_2_);
        if (LVar1 == 1) {
          printf("XCL:");
        }
        else {
          LVar1 = compare_chars((char *)local_30,"SYSTEM",pname._6_2_);
          if (LVar1 == 1) {
            printf("SI:");
          }
          else {
            LVar1 = compare_chars((char *)local_30,"KEYWORD",pname._6_2_);
            if (LVar1 == 1) {
              printf(":");
            }
            else {
              LVar1 = compare_chars((char *)local_30,"COMPILER",pname._6_2_);
              if (LVar1 == 1) {
                printf("XCLC:");
              }
              else {
                for (; pname._6_2_ != 0; pname._6_2_ = pname._6_2_ - 1) {
                  putchar((uint)*(byte *)((ulong)local_30 ^ 3));
                  local_30 = (DLword *)((long)local_30 + 1);
                }
                putchar(0x3a);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void print_package_name(int index) {
  PACKAGE *package;
  NEWSTRINGP *namestring;
  DLword len;
  char *pname;

  if (index == 0) {
    printf("#:");
    return;
  }
  package = (PACKAGE *)NativeAligned4FromLAddr(aref1(*Package_from_Index_word, index));
  namestring = (NEWSTRINGP *)NativeAligned4FromLAddr(package->NAME);
  pname = (char *)NativeAligned2FromLAddr(namestring->base);
  if (namestring->offset != 0) {
    pname += namestring->offset;
    printf("OFFSET:\n");
  }
  len = (DLword)(namestring->fillpointer);

  if (compare_chars(pname, "INTERLISP", len) == T) {
    printf("IL:");
    return;
  } else if (compare_chars(pname, "LISP", len) == T) {
    printf("CL:");
    return;
  } else if (compare_chars(pname, "XEROX-COMMON-LISP", len) == T) {
    printf("XCL:");
    return;
  } else if (compare_chars(pname, "SYSTEM", len) == T) {
    printf("SI:");
    return;
  } else if (compare_chars(pname, "KEYWORD", len) == T) {
    printf(":");
    return;
  } else if (compare_chars(pname, "COMPILER", len) == T) {
    printf("XCLC:");
    return;
  } else {
    while (len > 0) {
      putchar(GETBYTE(pname++));
      len--;
    }
    putchar(':');
    return;
  }

}